

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu2.c
# Opt level: O0

MPP_RET vdpu2_h264d_control(void *hal,MpiCmd cmd_type,void *param)

{
  H264dHalCtx_t *p_hal;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_type_local;
  void *hal_local;
  
  if ((hal == (void *)0x0) && ((hal_h264d_debug & 4) != 0)) {
    _mpp_log_l(4,"hal_h264d_vdpu_reg","input empty(%d).\n",(char *)0x0,0x457);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu2_h264d_control(void *hal, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    (void)hal;
    (void)cmd_type;
    (void)param;
__RETURN:
    return ret = MPP_OK;
}